

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_SubDComponentPtr::SubdivisionPoint(ON_3dPoint *__return_storage_ptr__,ON_SubDComponentPtr *this)

{
  uint uVar1;
  ON_SubDVertex *this_00;
  ON_SubDEdge *this_01;
  ON_SubDFace *this_02;
  ON_SubDFace *f;
  ON_SubDEdge *e;
  ON_SubDVertex *v;
  ON_SubDComponentPtr *this_local;
  
  uVar1 = (uint)this->m_ptr & 6;
  if (uVar1 == 2) {
    this_00 = Vertex(this);
    if (this_00 != (ON_SubDVertex *)0x0) {
      ON_SubDVertex::SubdivisionPoint(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
  }
  else if (uVar1 == 4) {
    this_01 = Edge(this);
    if (this_01 != (ON_SubDEdge *)0x0) {
      ON_SubDEdge::SubdivisionPoint(__return_storage_ptr__,this_01);
      return __return_storage_ptr__;
    }
  }
  else if ((uVar1 == 6) && (this_02 = Face(this), this_02 != (ON_SubDFace *)0x0)) {
    ON_SubDFace::SubdivisionPoint(__return_storage_ptr__,this_02);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
  __return_storage_ptr__->y = ON_3dPoint::NanPoint.y;
  __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDComponentPtr::SubdivisionPoint() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  {
    const ON_SubDVertex* v = Vertex();
    if (nullptr != v)
      return v->SubdivisionPoint();
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  {
    const ON_SubDEdge* e = Edge();
    if (nullptr != e)
      return e->SubdivisionPoint();
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_FACE:
  {
    const ON_SubDFace* f = Face();
    if (nullptr != f)
      return f->SubdivisionPoint();
  }
  break;
  }
  return ON_3dPoint::NanPoint;
}